

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O2

int per_binding(hash_key_t key,hash_data_t data,void *opaque)

{
  internal_binding_t *piVar1;
  FILE *pFVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  pFVar2 = _stderr;
  if (2 < debug_level) {
    uVar3 = gotcha_gettid();
    uVar4 = getpid();
    fprintf(pFVar2,"[%d/%d][%s:%u] - Trying to re-bind %s from tool %s after dlopen\n",(ulong)uVar3,
            (ulong)uVar4,"gotcha_dl.c",0x13,**(undefined8 **)((long)data + 8),*(undefined8 *)**data)
    ;
  }
  while (pFVar2 = _stderr, piVar1 = ((internal_binding_t *)data)->next_binding,
        piVar1 != (internal_binding_t *)0x0) {
    data = piVar1;
    if (2 < debug_level) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      fprintf(pFVar2,
              "[%d/%d][%s:%u] - Selecting new innermost version of binding %s from tool %s.\n",
              (ulong)uVar3,(ulong)uVar4,"gotcha_dl.c",0x18,piVar1->user_binding->name,
              piVar1->associated_binding_table->tool->tool_name);
    }
  }
  iVar5 = prepare_symbol((internal_binding_t *)data);
  pFVar2 = _stderr;
  if (iVar5 == -1) {
    if (2 < debug_level) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      fprintf(pFVar2,"[%d/%d][%s:%u] - Still could not prepare binding %s after dlopen\n",
              (ulong)uVar3,(ulong)uVar4,"gotcha_dl.c",0x1d,
              ((internal_binding_t *)data)->user_binding->name);
    }
  }
  else {
    removefrom_hashtable(&notfound_binding_table,key);
  }
  return 0;
}

Assistant:

static int per_binding(hash_key_t key, hash_data_t data, void *opaque KNOWN_UNUSED)
{
   int result;
   struct internal_binding_t *binding = (struct internal_binding_t *) data;

   debug_printf(3, "Trying to re-bind %s from tool %s after dlopen\n",
                binding->user_binding->name, binding->associated_binding_table->tool->tool_name);
   
   while (binding->next_binding) {
      binding = binding->next_binding;
      debug_printf(3, "Selecting new innermost version of binding %s from tool %s.\n",
                   binding->user_binding->name, binding->associated_binding_table->tool->tool_name);
   }
   
   result = prepare_symbol(binding);
   if (result == -1) {
      debug_printf(3, "Still could not prepare binding %s after dlopen\n", binding->user_binding->name);
      return 0;
   }

   removefrom_hashtable(&notfound_binding_table, key);
   return 0;
}